

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::compile_abi_cxx11_(string *__return_storage_ptr__,CompilerHLSL *this)

{
  bool bVar1;
  ExecutionModel EVar2;
  uint32_t id;
  SPIRFunction *func;
  SPIREntryPoint *pSVar3;
  bool local_75;
  Bitset local_68;
  uint32_t local_1c;
  CompilerHLSL *pCStack_18;
  uint32_t pass_count;
  CompilerHLSL *this_local;
  
  pCStack_18 = this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  ParsedIR::fixup_reserved_names(&(this->super_CompilerGLSL).super_Compiler.ir);
  (this->super_CompilerGLSL).options.es = false;
  (this->super_CompilerGLSL).options.version = 0x1c2;
  (this->super_CompilerGLSL).options.vulkan_semantics = true;
  (this->super_CompilerGLSL).backend.float_literal_suffix = true;
  (this->super_CompilerGLSL).backend.double_literal_suffix = false;
  (this->super_CompilerGLSL).backend.long_long_literal_suffix = true;
  (this->super_CompilerGLSL).backend.uint32_t_literal_suffix = true;
  (this->super_CompilerGLSL).backend.int16_t_literal_suffix = "";
  (this->super_CompilerGLSL).backend.uint16_t_literal_suffix = "u";
  (this->super_CompilerGLSL).backend.basic_int_type = "int";
  (this->super_CompilerGLSL).backend.basic_uint_type = "uint";
  ::std::__cxx11::string::operator=
            ((string *)&(this->super_CompilerGLSL).backend.demote_literal,"discard");
  (this->super_CompilerGLSL).backend.boolean_mix_function = "";
  (this->super_CompilerGLSL).backend.swizzle_is_function = false;
  (this->super_CompilerGLSL).backend.shared_is_implied = true;
  (this->super_CompilerGLSL).backend.unsized_array_supported = true;
  (this->super_CompilerGLSL).backend.explicit_struct_type = false;
  (this->super_CompilerGLSL).backend.use_initializer_list = true;
  (this->super_CompilerGLSL).backend.use_constructor_splatting = false;
  (this->super_CompilerGLSL).backend.can_swizzle_scalar = true;
  (this->super_CompilerGLSL).backend.can_declare_struct_inline = false;
  (this->super_CompilerGLSL).backend.can_declare_arrays_inline = false;
  (this->super_CompilerGLSL).backend.can_return_array = false;
  (this->super_CompilerGLSL).backend.nonuniform_qualifier = "NonUniformResourceIndex";
  (this->super_CompilerGLSL).backend.support_case_fallthrough = false;
  EVar2 = Compiler::get_execution_model((Compiler *)this);
  (this->super_CompilerGLSL).backend.force_merged_mesh_block = EVar2 == ExecutionModelMeshEXT;
  (this->super_CompilerGLSL).backend.force_gl_in_out_block =
       (bool)((this->super_CompilerGLSL).backend.force_merged_mesh_block & 1);
  local_75 = true;
  if ((this->hlsl_options).shader_model < 0x32) {
    local_75 = (this->hlsl_options).shader_model == 0x28;
  }
  (this->super_CompilerGLSL).backend.support_precise_qualifier = local_75;
  CompilerGLSL::fixup_anonymous_struct_names(&this->super_CompilerGLSL);
  CompilerGLSL::fixup_type_alias(&this->super_CompilerGLSL);
  CompilerGLSL::reorder_type_alias(&this->super_CompilerGLSL);
  Compiler::build_function_control_flow_graphs_and_analyze((Compiler *)this);
  validate_shader_model(this);
  Compiler::update_active_builtins((Compiler *)this);
  Compiler::analyze_image_and_sampler_usage((Compiler *)this);
  Compiler::analyze_interlocked_resource_usage((Compiler *)this);
  EVar2 = Compiler::get_execution_model((Compiler *)this);
  if (EVar2 == ExecutionModelMeshEXT) {
    analyze_meshlet_writes(this);
  }
  if (((this->super_CompilerGLSL).super_Compiler.need_subpass_input & 1U) != 0) {
    Bitset::set(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0xf);
  }
  if (0x43 < (this->hlsl_options).shader_model) {
    bVar1 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x2a);
    if (bVar1) {
      Bitset::set(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1148);
    }
    bVar1 = Bitset::get(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x2b);
    if (bVar1) {
      Bitset::set(&(this->super_CompilerGLSL).super_Compiler.active_input_builtins,0x1149);
    }
  }
  local_1c = 0;
  do {
    CompilerGLSL::reset(&this->super_CompilerGLSL,local_1c);
    StringStream<4096UL,_4096UL>::reset(&(this->super_CompilerGLSL).buffer);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0xe])();
    emit_resources(this);
    id = TypedID::operator_cast_to_unsigned_int
                   ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
    func = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
    local_68.higher._M_h._M_rehash_policy._M_next_resize = 0;
    local_68.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68.higher._M_h._M_element_count = 0;
    local_68.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_68.higher._M_h._M_rehash_policy._4_4_ = 0;
    local_68.higher._M_h._M_bucket_count = 0;
    local_68.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68.lower = 0;
    local_68.higher._M_h._M_buckets = (__buckets_ptr)0x0;
    Bitset::Bitset(&local_68);
    CompilerGLSL::emit_function(&this->super_CompilerGLSL,func,&local_68);
    Bitset::~Bitset(&local_68);
    emit_hlsl_entry_point(this);
    local_1c = local_1c + 1;
    bVar1 = Compiler::is_forcing_recompilation((Compiler *)this);
  } while (bVar1);
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  ::std::__cxx11::string::operator=((string *)&pSVar3->name,"main");
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,
             (StringStream<4096ul,4096ul> *)&(this->super_CompilerGLSL).buffer);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::compile()
{
	ir.fixup_reserved_names();

	// Do not deal with ES-isms like precision, older extensions and such.
	options.es = false;
	options.version = 450;
	options.vulkan_semantics = true;
	backend.float_literal_suffix = true;
	backend.double_literal_suffix = false;
	backend.long_long_literal_suffix = true;
	backend.uint32_t_literal_suffix = true;
	backend.int16_t_literal_suffix = "";
	backend.uint16_t_literal_suffix = "u";
	backend.basic_int_type = "int";
	backend.basic_uint_type = "uint";
	backend.demote_literal = "discard";
	backend.boolean_mix_function = "";
	backend.swizzle_is_function = false;
	backend.shared_is_implied = true;
	backend.unsized_array_supported = true;
	backend.explicit_struct_type = false;
	backend.use_initializer_list = true;
	backend.use_constructor_splatting = false;
	backend.can_swizzle_scalar = true;
	backend.can_declare_struct_inline = false;
	backend.can_declare_arrays_inline = false;
	backend.can_return_array = false;
	backend.nonuniform_qualifier = "NonUniformResourceIndex";
	backend.support_case_fallthrough = false;
	backend.force_merged_mesh_block = get_execution_model() == ExecutionModelMeshEXT;
	backend.force_gl_in_out_block = backend.force_merged_mesh_block;

	// SM 4.1 does not support precise for some reason.
	backend.support_precise_qualifier = hlsl_options.shader_model >= 50 || hlsl_options.shader_model == 40;

	fixup_anonymous_struct_names();
	fixup_type_alias();
	reorder_type_alias();
	build_function_control_flow_graphs_and_analyze();
	validate_shader_model();
	update_active_builtins();
	analyze_image_and_sampler_usage();
	analyze_interlocked_resource_usage();
	if (get_execution_model() == ExecutionModelMeshEXT)
		analyze_meshlet_writes();

	// Subpass input needs SV_Position.
	if (need_subpass_input)
		active_input_builtins.set(BuiltInFragCoord);

	// Need to offset by BaseVertex/BaseInstance in SM 6.8+.
	if (hlsl_options.shader_model >= 68)
	{
		if (active_input_builtins.get(BuiltInVertexIndex))
			active_input_builtins.set(BuiltInBaseVertex);
		if (active_input_builtins.get(BuiltInInstanceIndex))
			active_input_builtins.set(BuiltInBaseInstance);
	}

	uint32_t pass_count = 0;
	do
	{
		reset(pass_count);

		// Move constructor for this type is broken on GCC 4.9 ...
		buffer.reset();

		emit_header();
		emit_resources();

		emit_function(get<SPIRFunction>(ir.default_entry_point), Bitset());
		emit_hlsl_entry_point();

		pass_count++;
	} while (is_forcing_recompilation());

	// Entry point in HLSL is always main() for the time being.
	get_entry_point().name = "main";

	return buffer.str();
}